

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict spec_qual_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  uint uVar2;
  node_t_conflict n;
  node_t_conflict pnVar3;
  node_t_conflict extraout_RDX;
  node_t_conflict extraout_RDX_00;
  node_t_conflict pnVar4;
  bool bVar5;
  node *pnVar6;
  node_t_conflict local_38;
  
  ppVar1 = c2m_ctx->parse_ctx;
  pnVar4 = (node_t_conflict)0x54;
  n = new_node(c2m_ctx,N_LIST);
  local_38 = (node_t_conflict)0x0;
  bVar5 = false;
  pnVar3 = extraout_RDX;
  do {
    uVar2 = *(ushort *)ppVar1->curr_token - 0x114;
    if ((uVar2 < 0x28) && ((0x8004000401U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      pnVar3 = type_qual(c2m_ctx,(int)pnVar4);
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
    }
    else {
      pnVar3 = try_arg_f(c2m_ctx,(nonterm_arg_func_t)local_38,pnVar3);
      local_38 = pnVar3;
      if (pnVar3 == &err_struct) {
        pnVar6 = &err_struct;
        if (bVar5) {
          pnVar6 = n;
        }
        return pnVar6;
      }
    }
    pnVar4 = n;
    op_append(c2m_ctx,n,pnVar3);
    bVar5 = true;
    pnVar3 = extraout_RDX_00;
  } while( true );
}

Assistant:

D (spec_qual_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, op, r, arg = NULL;
  int first_p;

  list = new_node (c2m_ctx, N_LIST);
  for (first_p = TRUE;; first_p = FALSE) {
    if (C (T_CONST) || C (T_RESTRICT) || C (T_VOLATILE) || C (T_ATOMIC)) {
      P (type_qual);
      op = r;
    } else if ((op = TRY_A (type_spec, arg)) != err_node) {
      arg = op;
    } else if (first_p) {
      return err_node;
    } else {
      break;
    }
    op_append (c2m_ctx, list, op);
  }
  return list;
}